

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseRAPass::useTemporaryMem
          (BaseRAPass *this,BaseMem *out,uint32_t size,uint32_t alignment)

{
  uint32_t virtId_00;
  Error EVar1;
  uint in_ECX;
  char *in_RSI;
  long in_RDI;
  VirtReg *virtReg;
  uint32_t virtId;
  Error _err;
  char *in_stack_000002d0;
  int in_stack_000002dc;
  char *in_stack_000002e0;
  uint32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  BaseCompiler *in_stack_ffffffffffffff38;
  undefined4 local_84;
  int *local_80;
  long local_70;
  uint *local_68;
  long local_60;
  uint *local_58;
  long local_50;
  BaseCompiler *local_48;
  undefined4 *local_30;
  int *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  uint *local_18;
  
  if (0x40 < in_ECX) {
    DebugUtils::assertionFailed(in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
  }
  local_80 = (int *)(in_RDI + 0x1c8);
  local_20 = 0;
  local_1c = 0;
  local_84 = 0;
  local_30 = &local_84;
  local_28 = local_80;
  if (*local_80 == 0) {
    local_60 = in_RDI + 0x1c8;
    EVar1 = BaseCompiler::_newStack
                      (in_stack_ffffffffffffff38,
                       (BaseMem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,in_RSI);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  else {
    local_68 = (uint *)(in_RDI + 0x1c8);
    local_58 = local_68;
    local_18 = local_68;
    if ((*local_68 & 0x2000) == 0) {
      DebugUtils::assertionFailed(in_stack_000002e0,in_stack_000002dc,in_stack_000002d0);
    }
    local_70 = in_RDI + 0x1c8;
    local_50 = local_70;
    local_48 = (BaseCompiler *)
               BaseCompiler::virtRegById
                         ((BaseCompiler *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffedc);
    virtId_00._0_1_ = (local_48->super_BaseBuilder).super_BaseEmitter._emitterType;
    virtId_00._1_1_ = (local_48->super_BaseBuilder).super_BaseEmitter._emitterFlags;
    virtId_00._2_1_ = (local_48->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
    virtId_00._3_1_ = (local_48->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
    BaseCompiler::setStackSize
              (local_48,virtId_00,
               (uint)(byte)(char)(local_48->super_BaseBuilder).super_BaseEmitter._validationFlags,
               (uint32_t)((ulong)in_RDI >> 0x20));
  }
  *(undefined4 *)in_RSI = *(undefined4 *)(in_RDI + 0x1c8);
  *(undefined4 *)(in_RSI + 4) = *(undefined4 *)(in_RDI + 0x1cc);
  *(undefined4 *)(in_RSI + 8) = *(undefined4 *)(in_RDI + 0x1d0);
  *(undefined4 *)(in_RSI + 0xc) = *(undefined4 *)(in_RDI + 0x1d4);
  return 0;
}

Assistant:

Error BaseRAPass::useTemporaryMem(BaseMem& out, uint32_t size, uint32_t alignment) noexcept {
  ASMJIT_ASSERT(alignment <= 64);

  if (_temporaryMem.isNone()) {
    ASMJIT_PROPAGATE(cc()->_newStack(&_temporaryMem.as<BaseMem>(), size, alignment));
  }
  else {
    ASMJIT_ASSERT(_temporaryMem.as<BaseMem>().isRegHome());

    uint32_t virtId = _temporaryMem.as<BaseMem>().baseId();
    VirtReg* virtReg = cc()->virtRegById(virtId);

    cc()->setStackSize(virtId, Support::max(virtReg->virtSize(), size),
                               Support::max(virtReg->alignment(), alignment));
  }

  out = _temporaryMem.as<BaseMem>();
  return kErrorOk;
}